

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int addk(FuncState *fs,TValue *k,TValue *v)

{
  int iVar1;
  GCObject *o;
  void *pvVar2;
  undefined8 *puVar3;
  int iVar4;
  GCObject *in_RDX;
  void *in_RSI;
  lua_State *in_RDI;
  TValue *o1;
  TValue *o2;
  TValue *i_o;
  int oldsize;
  Proto *f;
  TValue *idx;
  lua_State *L;
  TValue *in_stack_ffffffffffffffa8;
  Table *in_stack_ffffffffffffffb0;
  lua_State *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  GCObject *errormsg;
  global_State *size_elems;
  int local_4;
  
  size_elems = in_RDI->l_G;
  o = (GCObject *)
      luaH_set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  errormsg = in_RDI->next;
  iVar4 = *(int *)((long)errormsg + 0x4c);
  if (*(int *)&(o->gch).tt == 3) {
    local_4 = (int)*(double *)o;
  }
  else {
    *(double *)o = (double)*(int *)&in_RDI->stack;
    *(int *)&(o->gch).tt = 3;
    if (*(int *)((long)errormsg + 0x4c) < *(int *)&in_RDI->stack + 1) {
      pvVar2 = luaM_growaux_(in_RDI,in_RSI,(int *)in_RDX,(size_t)size_elems,(int)((ulong)o >> 0x20),
                             (char *)errormsg);
      *(void **)((long)errormsg + 0x10) = pvVar2;
    }
    for (; iVar4 < *(int *)((long)errormsg + 0x4c); iVar4 = iVar4 + 1) {
      *(undefined4 *)(*(long *)((long)errormsg + 0x10) + (long)iVar4 * 0x10 + 8) = 0;
    }
    puVar3 = (undefined8 *)(*(long *)((long)errormsg + 0x10) + (long)*(int *)&in_RDI->stack * 0x10);
    *puVar3 = (in_RDX->gch).next;
    *(undefined4 *)(puVar3 + 1) = *(undefined4 *)&(in_RDX->gch).tt;
    iVar1._0_1_ = *(lu_byte *)((long)in_RDX + 8);
    iVar1._1_1_ = *(lu_byte *)((long)in_RDX + 9);
    iVar1._2_2_ = *(undefined2 *)((long)in_RDX + 10);
    if (((3 < iVar1) && (((((in_RDX->gch).next)->gch).marked & 3) != 0)) &&
       ((undefined1  [184])((undefined1  [184])*errormsg & (undefined1  [184])0x400) !=
        (undefined1  [184])0x0)) {
      luaC_barrierf((lua_State *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),o,in_RDX);
    }
    local_4 = *(int *)&in_RDI->stack;
    *(int *)&in_RDI->stack = local_4 + 1;
  }
  return local_4;
}

Assistant:

static int addk(FuncState*fs,TValue*k,TValue*v){
lua_State*L=fs->L;
TValue*idx=luaH_set(L,fs->h,k);
Proto*f=fs->f;
int oldsize=f->sizek;
if(ttisnumber(idx)){
return cast_int(nvalue(idx));
}
else{
setnvalue(idx,cast_num(fs->nk));
luaM_growvector(L,f->k,fs->nk,f->sizek,TValue,
((1<<(9+9))-1),"constant table overflow");
while(oldsize<f->sizek)setnilvalue(&f->k[oldsize++]);
setobj(L,&f->k[fs->nk],v);
luaC_barrier(L,f,v);
return fs->nk++;
}
}